

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.h
# Opt level: O0

int hydro_sign_final_verify(hydro_sign_state *state,uint8_t *csig,uint8_t *pk)

{
  int iVar1;
  uint8_t *in_RSI;
  uint8_t *nonce;
  uint8_t prehash [64];
  uint8_t challenge [32];
  uint8_t *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  uint8_t *in_stack_ffffffffffffffa0;
  hydro_hash_state *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  
  hydro_hash_final(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  hydro_sign_challenge
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (uint8_t *)in_stack_ffffffffffffffa8);
  iVar1 = hydro_sign_verify_challenge(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RSI);
  return iVar1;
}

Assistant:

int
hydro_sign_final_verify(hydro_sign_state *state, const uint8_t csig[hydro_sign_BYTES],
                        const uint8_t pk[hydro_sign_PUBLICKEYBYTES])
{
    uint8_t        challenge[hydro_sign_CHALLENGEBYTES];
    uint8_t        prehash[hydro_sign_PREHASHBYTES];
    const uint8_t *nonce = &csig[0];

    hydro_hash_final(&state->hash_st, prehash, sizeof prehash);
    hydro_sign_challenge(challenge, nonce, pk, prehash);

    return hydro_sign_verify_challenge(csig, challenge, pk);
}